

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::
       lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       ::token_type_name(token_type t)

{
  token_type t_local;
  char *local_8;
  
  switch(t) {
  case uninitialized:
    local_8 = "<uninitialized>";
    break;
  case literal_true:
    local_8 = "true literal";
    break;
  case literal_false:
    local_8 = "false literal";
    break;
  case literal_null:
    local_8 = "null literal";
    break;
  case value_string:
    local_8 = "string literal";
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    local_8 = "number literal";
    break;
  case begin_array:
    local_8 = "\'[\'";
    break;
  case begin_object:
    local_8 = "\'{\'";
    break;
  case end_array:
    local_8 = "\']\'";
    break;
  case end_object:
    local_8 = "\'}\'";
    break;
  case name_separator:
    local_8 = "\':\'";
    break;
  case value_separator:
    local_8 = "\',\'";
    break;
  case parse_error:
    local_8 = "<parse error>";
    break;
  case end_of_input:
    local_8 = "end of input";
    break;
  case literal_or_value:
    local_8 = "\'[\', \'{\', or a literal";
    break;
  default:
    local_8 = "unknown token";
  }
  return local_8;
}

Assistant:

static const char* token_type_name(const token_type t) noexcept
    {
        switch (t)
        {
            case token_type::uninitialized:
                return "<uninitialized>";
            case token_type::literal_true:
                return "true literal";
            case token_type::literal_false:
                return "false literal";
            case token_type::literal_null:
                return "null literal";
            case token_type::value_string:
                return "string literal";
            case lexer::token_type::value_unsigned:
            case lexer::token_type::value_integer:
            case lexer::token_type::value_float:
                return "number literal";
            case token_type::begin_array:
                return "'['";
            case token_type::begin_object:
                return "'{'";
            case token_type::end_array:
                return "']'";
            case token_type::end_object:
                return "'}'";
            case token_type::name_separator:
                return "':'";
            case token_type::value_separator:
                return "','";
            case token_type::parse_error:
                return "<parse error>";
            case token_type::end_of_input:
                return "end of input";
            case token_type::literal_or_value:
                return "'[', '{', or a literal";
            default: // catch non-enum values
                return "unknown token"; // LCOV_EXCL_LINE
        }
    }